

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackNN.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  uint uVar2;
  double *pdVar3;
  void *pvVar4;
  void *pvVar5;
  undefined8 *in_RSI;
  int in_EDI;
  double dVar6;
  undefined8 uVar7;
  NaException *ex;
  int nRecords;
  int j;
  int iLayer;
  int iEpoch;
  NaReal *pErr;
  NaReal *pOut;
  NaReal *pTar;
  NaReal *pIn;
  NaStdBackProp bpe;
  NaDataFile *dfErrOnIn;
  NaDataFile *dfDataOut;
  NaDataFile *dfTargetOut;
  NaDataFile *dfDataIn;
  uint nOutDim;
  uint nInpDim;
  NaNNUnit nnu;
  NaReal *in_stack_fffffffffffff1d0;
  undefined8 in_stack_fffffffffffff1d8;
  NaDataFile *in_stack_fffffffffffff1e0;
  byte local_e01;
  uint local_d88;
  uint local_d84;
  uint local_d80;
  NaStdBackProp local_d58 [1824];
  long *local_638;
  long *local_630;
  long *local_628;
  long *local_620;
  uint local_614;
  uint local_610;
  NaNNUnit local_600 [1520];
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI == 6) {
    local_10 = in_RSI;
    NaOpenLogFile("BackNN.log");
    signal(2,handle_sigint);
    NaNNUnit::NaNNUnit(local_600);
    NaNNUnit::Load((char *)local_600);
    local_610 = NaUnit::InputDim();
    local_614 = NaUnit::OutputDim();
    local_620 = (long *)OpenInputDataFile((char *)local_10[2]);
    local_628 = (long *)OpenInputDataFile((char *)local_10[3]);
    local_630 = (long *)OpenOutputDataFile((char *)local_10[4],bdtAuto,local_614);
    local_638 = (long *)OpenOutputDataFile((char *)local_10[5],bdtAuto,local_610);
    NaStdBackProp::NaStdBackProp(local_d58,local_600);
    pdVar3 = (double *)operator_new__((ulong)local_610 << 3);
    pvVar4 = operator_new__((ulong)local_614 << 3);
    operator_new__((ulong)local_614 << 3);
    pvVar5 = operator_new__((ulong)local_610 << 3);
    bVar1 = (**(code **)(*local_620 + 0x28))();
    if (((bVar1 & 1) != 0) && (bVar1 = (**(code **)(*local_628 + 0x28))(), (bVar1 & 1) != 0)) {
      local_d88 = 0;
      do {
        for (local_d84 = 0; local_d84 < local_610; local_d84 = local_d84 + 1) {
          dVar6 = (double)(**(code **)(*local_620 + 0x18))(local_620,local_d84);
          pdVar3[(int)local_d84] = dVar6;
        }
        for (local_d84 = 0; local_d84 < local_614; local_d84 = local_d84 + 1) {
          uVar7 = (**(code **)(*local_628 + 0x18))(local_628,local_d84);
          *(undefined8 *)((long)pvVar4 + (long)(int)local_d84 * 8) = uVar7;
        }
        for (local_d84 = 0; local_d84 < local_610; local_d84 = local_d84 + 1) {
          *(undefined8 *)((long)pvVar5 + (long)(int)local_d84 * 8) = 0;
        }
        local_d88 = local_d88 + 1;
        NaNNUnit::Function((double *)local_600,pdVar3);
        for (local_d80 = NaNNUnit::OutputLayer(); -1 < (int)local_d80; local_d80 = local_d80 - 1) {
          uVar2 = NaNNUnit::OutputLayer();
          if (uVar2 == local_d80) {
            NaStdBackProp::DeltaRule((double *)local_d58,SUB81(pvVar4,0));
          }
          else {
            NaStdBackProp::DeltaRule((uint)local_d58,local_d80);
          }
        }
        for (local_d84 = 0; local_d84 < local_610; local_d84 = local_d84 + 1) {
          dVar6 = (double)NaStdBackProp::PartOfDeltaRule((uint)local_d58,0);
          *(double *)((long)pvVar5 + (long)(int)local_d84 * 8) =
               *(double *)((long)pvVar5 + (long)(int)local_d84 * 8) - dVar6;
        }
        write_output(in_stack_fffffffffffff1e0,(uint)((ulong)in_stack_fffffffffffff1d8 >> 0x20),
                     in_stack_fffffffffffff1d0);
        write_output(in_stack_fffffffffffff1e0,(uint)((ulong)in_stack_fffffffffffff1d8 >> 0x20),
                     in_stack_fffffffffffff1d0);
        printf("%d records done\r",(ulong)local_d88);
        local_e01 = 0;
        if ((bTerminate & 1U) == 0) {
          bVar1 = (**(code **)(*local_620 + 0x20))();
          local_e01 = 0;
          if ((bVar1 & 1) != 0) {
            local_e01 = (**(code **)(*local_628 + 0x20))();
          }
        }
      } while ((local_e01 & 1) != 0);
    }
    putchar(10);
    if (local_638 != (long *)0x0) {
      (**(code **)(*local_638 + 8))();
    }
    if (local_630 != (long *)0x0) {
      (**(code **)(*local_630 + 8))();
    }
    if (local_628 != (long *)0x0) {
      (**(code **)(*local_628 + 8))();
    }
    if (local_620 != (long *)0x0) {
      (**(code **)(*local_620 + 8))();
    }
    NaStdBackProp::~NaStdBackProp(local_d58);
    NaNNUnit::~NaNNUnit(local_600);
  }
  else {
    printf("Usage: %s NN-file DataIn DesiredOut DataOut ErrOnIn\n where NN-file    - evaluated neural network (not changed)\n       DataIn     - network input (=input dimension)\n       DesiredOut - target output (=output dimension)\n       DataOut    - output produced by the network\n       ErrOnIn    - error on input produced by the network\n"
           ,*in_RSI);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main (int argc, char* argv[])
{
  if(argc != 6)
    {
      printf("Usage: %s NN-file DataIn DesiredOut DataOut ErrOnIn\n"\
	     " where NN-file    - evaluated neural network (not changed)\n"\
	     "       DataIn     - network input (=input dimension)\n"\
	     "       DesiredOut - target output (=output dimension)\n"\
	     "       DataOut    - output produced by the network\n"\
	     "       ErrOnIn    - error on input produced by the network\n",
	     argv[0]);
      return 1;
    }

  NaOpenLogFile("BackNN.log");

  /* Let's handle SIGINT(2) */
  signal(SIGINT, handle_sigint);

  try{
    NaNNUnit            nnu;
    nnu.Load(argv[1]);

    unsigned	nInpDim = nnu.InputDim();
    unsigned	nOutDim = nnu.OutputDim();

    NaDataFile	*dfDataIn = OpenInputDataFile(argv[2]);
    NaDataFile	*dfTargetOut = OpenInputDataFile(argv[3]);
    NaDataFile	*dfDataOut = OpenOutputDataFile(argv[4], bdtAuto, nOutDim);
    NaDataFile	*dfErrOnIn = OpenOutputDataFile(argv[5], bdtAuto, nInpDim);

    NaStdBackProp	bpe(nnu);

    /* Prepare buffers for input, target and output data */
    NaReal	*pIn = new NaReal[nInpDim];
    NaReal	*pTar = new NaReal[nOutDim];
    NaReal	*pOut = new NaReal[nOutDim];
    NaReal	*pErr = new NaReal[nInpDim];

    /* Let's start the forward-backward propagation */
    int	iEpoch = 0, iLayer, j;

    if(dfDataIn->GoStartRecord() && dfTargetOut->GoStartRecord()) {
	int	nRecords = 0;

	do{
	    /* Read the learning pair */
	    for(j = 0; j < nInpDim; ++j)
		pIn[j] = dfDataIn->GetValue(j);
	    for(j = 0; j < nOutDim; ++j)
		pTar[j] = dfTargetOut->GetValue(j);

	    for(j = 0; j < nInpDim; ++j)
		pErr[j] = 0.0;

	    ++nRecords;

	    /* Pass through the net in forward direction */
	    nnu.Function(pIn, pOut);

	    /* Pass through the net in backward direction */
	    for(iLayer = nnu.OutputLayer(); iLayer >= 0; --iLayer)
		{
		    if(nnu.OutputLayer() == iLayer)
			/* Output layer */
			bpe.DeltaRule(pTar);
		    else
			/* Hidden layer */
			bpe.DeltaRule(iLayer, iLayer + 1);
		}

	    /* Compute error on input */
	    for(j = 0; j < nInpDim; ++j){
		// Or may be += ???  I didn't recognize the difference...
		pErr[j] -= bpe.PartOfDeltaRule(0, j);
	    }

	    write_output(dfDataOut, nOutDim, pOut);
	    write_output(dfErrOnIn, nInpDim, pErr);

	    /* Display epoch number, learning and testing errors */
	    printf("%d records done\r", nRecords);

	}while(!bTerminate
	       && dfDataIn->GoNextRecord()
	       && dfTargetOut->GoNextRecord());
    }

    putchar('\n');

    delete dfErrOnIn;
    delete dfDataOut;
    delete dfTargetOut;
    delete dfDataIn;
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
  }
}